

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O1

void poptJlu32lpair(void *key,size_t size,uint32_t *pc,uint32_t *pb)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  uVar5 = (int)size + *pc + 0xdeadbeef;
  uVar2 = uVar5;
  if (key == (void *)0x0) goto LAB_00107b81;
  uVar2 = *pb + uVar5;
  uVar6 = uVar5;
  if (((ulong)key & 3) != 0) {
    if (((ulong)key & 1) != 0) {
      if (0xc < size) {
        do {
          iVar3 = (uint)*(byte *)((long)key + 7) * 0x1000000 +
                  (uint)*(byte *)((long)key + 6) * 0x10000 +
                  (uint)*(byte *)((long)key + 5) * 0x100 + (byte)*(uint *)((long)key + 4) + uVar5;
          uVar5 = (uint)*(byte *)((long)key + 0xb) * 0x1000000 +
                  (uint)*(byte *)((long)key + 10) * 0x10000 +
                  (uint)*(byte *)((long)key + 9) * 0x100 + (byte)*(uint *)((long)key + 8) + uVar2;
          uVar2 = (uVar5 * 0x10 | uVar5 >> 0x1c) ^
                  ((uint)*(byte *)((long)key + 3) * 0x1000000 +
                   (uint)*(byte *)((long)key + 2) * 0x10000 +
                  (uint)*(byte *)((long)key + 1) * 0x100 + (byte)*key + uVar6) - uVar5;
          iVar7 = uVar5 + iVar3;
          uVar5 = (uVar2 << 6 | uVar2 >> 0x1a) ^ iVar3 - uVar2;
          iVar3 = uVar2 + iVar7;
          uVar2 = (uVar5 << 8 | uVar5 >> 0x18) ^ iVar7 - uVar5;
          iVar7 = uVar5 + iVar3;
          uVar6 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar3 - uVar2;
          iVar3 = uVar2 + iVar7;
          uVar5 = (uVar6 << 0x13 | uVar6 >> 0xd) ^ iVar7 - uVar6;
          uVar6 = uVar6 + iVar3;
          uVar2 = (uVar5 << 4 | uVar5 >> 0x1c) ^ iVar3 - uVar5;
          uVar5 = uVar5 + uVar6;
          size = size - 0xc;
          key = (void *)((long)key + 0xc);
        } while (0xc < size);
      }
      switch(size) {
      case 0:
        goto switchD_00107877_caseD_0;
      case 1:
        break;
      case 0xc:
        uVar2 = uVar2 + (uint)*(byte *)((long)key + 0xb) * 0x1000000;
      case 0xb:
        uVar2 = uVar2 + (uint)*(byte *)((long)key + 10) * 0x10000;
      case 10:
        uVar2 = uVar2 + (uint)*(byte *)((long)key + 9) * 0x100;
      case 9:
        uVar2 = uVar2 + (byte)*(uint *)((long)key + 8);
      case 8:
        uVar5 = uVar5 + (uint)*(byte *)((long)key + 7) * 0x1000000;
      case 7:
        uVar5 = uVar5 + (uint)*(byte *)((long)key + 6) * 0x10000;
      case 6:
        uVar5 = uVar5 + (uint)*(byte *)((long)key + 5) * 0x100;
      case 5:
        uVar5 = uVar5 + (byte)*(uint *)((long)key + 4);
      case 4:
        uVar6 = uVar6 + (uint)*(byte *)((long)key + 3) * 0x1000000;
      case 3:
        uVar6 = uVar6 + (uint)*(byte *)((long)key + 2) * 0x10000;
      case 2:
        uVar6 = uVar6 + (uint)*(byte *)((long)key + 1) * 0x100;
      }
switchD_00107877_caseD_1:
      uVar4 = (uint)(byte)*key;
      goto LAB_00107b00;
    }
    if (0xc < size) {
      do {
        uVar2 = uVar2 + *(uint *)((long)key + 8);
        uVar6 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar6 + *key) - uVar2;
        iVar3 = uVar2 + uVar5 + *(uint *)((long)key + 4);
        uVar5 = (uVar6 << 6 | uVar6 >> 0x1a) ^ (uVar5 + *(uint *)((long)key + 4)) - uVar6;
        iVar7 = uVar6 + iVar3;
        uVar2 = (uVar5 << 8 | uVar5 >> 0x18) ^ iVar3 - uVar5;
        iVar8 = uVar5 + iVar7;
        uVar6 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar7 - uVar2;
        iVar3 = uVar2 + iVar8;
        uVar5 = (uVar6 << 0x13 | uVar6 >> 0xd) ^ iVar8 - uVar6;
        uVar6 = uVar6 + iVar3;
        uVar2 = (uVar5 << 4 | uVar5 >> 0x1c) ^ iVar3 - uVar5;
        uVar5 = uVar5 + uVar6;
        size = size - 0xc;
        key = (void *)((long)key + 0xc);
      } while (0xc < size);
    }
    switch(size) {
    case 0:
switchD_00107877_caseD_0:
      bVar1 = false;
      goto LAB_00107b2e;
    case 1:
      goto switchD_00107877_caseD_1;
    case 2:
      goto switchD_00107877_caseD_2;
    case 3:
      uVar6 = uVar6 + (uint)*(byte *)((long)key + 2) * 0x10000;
      goto switchD_00107877_caseD_2;
    case 4:
      goto switchD_00107877_caseD_4;
    case 5:
      uVar4 = (uint)(byte)*(uint *)((long)key + 4);
      goto LAB_00107b25;
    case 6:
      goto switchD_00107877_caseD_6;
    case 7:
      uVar5 = uVar5 + (uint)*(byte *)((long)key + 6) * 0x10000;
      goto switchD_00107877_caseD_6;
    case 9:
      uVar2 = uVar2 + (byte)*(uint *)((long)key + 8);
      break;
    case 10:
      goto switchD_00107877_caseD_a;
    case 0xb:
      uVar2 = uVar2 + (uint)*(byte *)((long)key + 10) * 0x10000;
      goto switchD_00107877_caseD_a;
    case 0xc:
      uVar2 = uVar2 + *(uint *)((long)key + 8);
    }
    uVar5 = uVar5 + *(uint *)((long)key + 4);
switchD_00107877_caseD_4:
    uVar6 = uVar6 + *key;
    goto LAB_00107b2b;
  }
  if (0xc < size) {
    do {
      uVar2 = uVar2 + *(uint *)((long)key + 8);
      uVar6 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar6 + *key) - uVar2;
      iVar3 = uVar2 + uVar5 + *(uint *)((long)key + 4);
      uVar5 = (uVar6 << 6 | uVar6 >> 0x1a) ^ (uVar5 + *(uint *)((long)key + 4)) - uVar6;
      iVar7 = uVar6 + iVar3;
      uVar2 = (uVar5 << 8 | uVar5 >> 0x18) ^ iVar3 - uVar5;
      iVar8 = uVar5 + iVar7;
      uVar6 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar7 - uVar2;
      iVar3 = uVar2 + iVar8;
      uVar5 = (uVar6 << 0x13 | uVar6 >> 0xd) ^ iVar8 - uVar6;
      uVar6 = uVar6 + iVar3;
      uVar2 = (uVar5 << 4 | uVar5 >> 0x1c) ^ iVar3 - uVar5;
      uVar5 = uVar5 + uVar6;
      size = size - 0xc;
      key = (void *)((long)key + 0xc);
    } while (0xc < size);
  }
  switch(size) {
  case 0:
    goto switchD_00107877_caseD_0;
  case 1:
    goto switchD_00107877_caseD_1;
  case 2:
    goto switchD_00107877_caseD_2;
  case 3:
    uVar4 = *key & 0xffffff;
    goto LAB_00107b00;
  case 4:
    goto switchD_00107918_caseD_4;
  case 5:
    uVar4 = (uint)(byte)*(uint *)((long)key + 4);
    break;
  case 6:
    uVar4 = (uint)(ushort)*(uint *)((long)key + 4);
    break;
  case 7:
    uVar4 = *(uint *)((long)key + 4) & 0xffffff;
    break;
  case 8:
    goto switchD_00107918_caseD_8;
  case 9:
    uVar4 = (uint)(byte)*(uint *)((long)key + 8);
    goto LAB_00107a6f;
  case 10:
    uVar4 = (uint)(ushort)*(uint *)((long)key + 8);
    goto LAB_00107a6f;
  case 0xb:
    uVar4 = *(uint *)((long)key + 8) & 0xffffff;
LAB_00107a6f:
    uVar2 = uVar2 + uVar4;
switchD_00107918_caseD_8:
    uVar5 = uVar5 + *(uint *)((long)key + 4);
    goto switchD_00107918_caseD_4;
  case 0xc:
    uVar2 = uVar2 + *(uint *)((long)key + 8);
    goto switchD_00107918_caseD_8;
  }
  uVar5 = uVar5 + uVar4;
switchD_00107918_caseD_4:
  uVar4 = *key;
LAB_00107b00:
  uVar6 = uVar6 + uVar4;
LAB_00107b2b:
  bVar1 = true;
LAB_00107b2e:
  if (bVar1) {
    uVar2 = (uVar2 ^ uVar5) - (uVar5 << 0xe | uVar5 >> 0x12);
    uVar6 = (uVar6 ^ uVar2) - (uVar2 * 0x800 | uVar2 >> 0x15);
    uVar5 = (uVar5 ^ uVar6) - (uVar6 * 0x2000000 | uVar6 >> 7);
    uVar2 = (uVar2 ^ uVar5) - (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar6 = (uVar6 ^ uVar2) - (uVar2 * 0x10 | uVar2 >> 0x1c);
    uVar5 = (uVar5 ^ uVar6) - (uVar6 * 0x4000 | uVar6 >> 0x12);
    uVar2 = (uVar2 ^ uVar5) - (uVar5 * 0x1000000 | uVar5 >> 8);
  }
LAB_00107b81:
  *pc = uVar2;
  *pb = uVar5;
  return;
switchD_00107877_caseD_a:
  uVar5 = uVar5 + *(uint *)((long)key + 4);
  uVar2 = uVar2 + (ushort)*(uint *)((long)key + 8);
  goto switchD_00107877_caseD_4;
switchD_00107877_caseD_6:
  uVar4 = (uint)(ushort)*(uint *)((long)key + 4);
LAB_00107b25:
  uVar5 = uVar5 + uVar4;
  goto switchD_00107877_caseD_4;
switchD_00107877_caseD_2:
  uVar4 = (uint)(ushort)*key;
  goto LAB_00107b00;
}

Assistant:

void jlu32lpair(const void *key, size_t size, uint32_t *pc, uint32_t *pb)
{
    union { const void *ptr; size_t i; } u;
    uint32_t a = _JLU3_INIT(*pc, size);
    uint32_t b = a;
    uint32_t c = a;

    if (key == NULL)
	goto exit;

    c += *pb;	/* Add the secondary hash. */

    u.ptr = key;
    if (HASH_LITTLE_ENDIAN && ((u.i & 0x3) == 0)) {
	const uint32_t *k = (const uint32_t *)key;	/* read 32-bit chunks */
#ifdef	VALGRIND
	const uint8_t  *k8;
#endif

	/*-- all but last block: aligned reads and affect 32 bits of (a,b,c) */
	while (size > (size_t)12) {
	    a += k[0];
	    b += k[1];
	    c += k[2];
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 3;
	}
	/*------------------------- handle the last (probably partial) block */
	/* 
	 * "k[2]&0xffffff" actually reads beyond the end of the string, but
	 * then masks off the part it's not allowed to read.  Because the
	 * string is aligned, the masked-off tail is in the same word as the
	 * rest of the string.  Every machine with memory protection I've seen
	 * does it on word boundaries, so is OK with this.  But VALGRIND will
	 * still catch it and complain.  The masking trick does make the hash
	 * noticeably faster for short strings (like English words).
	 */
#ifndef VALGRIND

	switch (size) {
	case 12:	c += k[2]; b+=k[1]; a+=k[0]; break;
	case 11:	c += k[2]&0xffffff; b+=k[1]; a+=k[0]; break;
	case 10:	c += k[2]&0xffff; b+=k[1]; a+=k[0]; break;
	case  9:	c += k[2]&0xff; b+=k[1]; a+=k[0]; break;
	case  8:	b += k[1]; a+=k[0]; break;
	case  7:	b += k[1]&0xffffff; a+=k[0]; break;
	case  6:	b += k[1]&0xffff; a+=k[0]; break;
	case  5:	b += k[1]&0xff; a+=k[0]; break;
	case  4:	a += k[0]; break;
	case  3:	a += k[0]&0xffffff; break;
	case  2:	a += k[0]&0xffff; break;
	case  1:	a += k[0]&0xff; break;
	case  0:	goto exit;
	}

#else /* make valgrind happy */

	k8 = (const uint8_t *)k;
	switch (size) {
	case 12:	c += k[2]; b+=k[1]; a+=k[0];	break;
	case 11:	c += ((uint32_t)k8[10])<<16;	/* fallthrough */
	case 10:	c += ((uint32_t)k8[9])<<8;	/* fallthrough */
	case  9:	c += k8[8];			/* fallthrough */
	case  8:	b += k[1]; a+=k[0];		break;
	case  7:	b += ((uint32_t)k8[6])<<16;	/* fallthrough */
	case  6:	b += ((uint32_t)k8[5])<<8;	/* fallthrough */
	case  5:	b += k8[4];			/* fallthrough */
	case  4:	a += k[0];			break;
	case  3:	a += ((uint32_t)k8[2])<<16;	/* fallthrough */
	case  2:	a += ((uint32_t)k8[1])<<8;	/* fallthrough */
	case  1:	a += k8[0];			break;
	case  0:	goto exit;
	}

#endif /* !valgrind */

    } else if (HASH_LITTLE_ENDIAN && ((u.i & 0x1) == 0)) {
	const uint16_t *k = (const uint16_t *)key;	/* read 16-bit chunks */
	const uint8_t  *k8;

	/*----------- all but last block: aligned reads and different mixing */
	while (size > (size_t)12) {
	    a += k[0] + (((uint32_t)k[1])<<16);
	    b += k[2] + (((uint32_t)k[3])<<16);
	    c += k[4] + (((uint32_t)k[5])<<16);
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 6;
	}

	/*------------------------- handle the last (probably partial) block */
	k8 = (const uint8_t *)k;
	switch (size) {
	case 12:
	    c += k[4]+(((uint32_t)k[5])<<16);
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case 11:
	    c += ((uint32_t)k8[10])<<16;
	    /* fallthrough */
	case 10:
	    c += k[4];
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  9:
	    c += k8[8];
	    /* fallthrough */
	case  8:
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  7:
	    b += ((uint32_t)k8[6])<<16;
	    /* fallthrough */
	case  6:
	    b += k[2];
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  5:
	    b += k8[4];
	    /* fallthrough */
	case  4:
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  3:
	    a += ((uint32_t)k8[2])<<16;
	    /* fallthrough */
	case  2:
	    a += k[0];
	    break;
	case  1:
	    a += k8[0];
	    break;
	case  0:
	    goto exit;
	}

    } else {		/* need to read the key one byte at a time */
	const uint8_t *k = (const uint8_t *)key;

	/*----------- all but the last block: affect some 32 bits of (a,b,c) */
	while (size > (size_t)12) {
	    a += k[0];
	    a += ((uint32_t)k[1])<<8;
	    a += ((uint32_t)k[2])<<16;
	    a += ((uint32_t)k[3])<<24;
	    b += k[4];
	    b += ((uint32_t)k[5])<<8;
	    b += ((uint32_t)k[6])<<16;
	    b += ((uint32_t)k[7])<<24;
	    c += k[8];
	    c += ((uint32_t)k[9])<<8;
	    c += ((uint32_t)k[10])<<16;
	    c += ((uint32_t)k[11])<<24;
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 12;
	}

	/*---------------------------- last block: affect all 32 bits of (c) */
	switch (size) {
	case 12:	c += ((uint32_t)k[11])<<24;	/* fallthrough */
	case 11:	c += ((uint32_t)k[10])<<16;	/* fallthrough */
	case 10:	c += ((uint32_t)k[9])<<8;	/* fallthrough */
	case  9:	c += k[8];			/* fallthrough */
	case  8:	b += ((uint32_t)k[7])<<24;	/* fallthrough */
	case  7:	b += ((uint32_t)k[6])<<16;	/* fallthrough */
	case  6:	b += ((uint32_t)k[5])<<8;	/* fallthrough */
	case  5:	b += k[4];			/* fallthrough */
	case  4:	a += ((uint32_t)k[3])<<24;	/* fallthrough */
	case  3:	a += ((uint32_t)k[2])<<16;	/* fallthrough */
	case  2:	a += ((uint32_t)k[1])<<8;	/* fallthrough */
	case  1:	a += k[0];
	    break;
	case  0:
	    goto exit;
	}
    }

    _JLU3_FINAL(a,b,c);

exit:
    *pc = c;
    *pb = b;
    return;
}